

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

Vector<char,_std::allocator<char>_> *
amrex::SerializeStringArray
          (Vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringArray)

{
  pointer pbVar1;
  char *__dest;
  ostream *poVar2;
  long lVar3;
  int i;
  long lVar4;
  allocator_type local_1c9;
  char *local_1c8;
  long local_1c0;
  ostringstream stringStream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stringStream);
  lVar3 = 0;
  for (lVar4 = 0;
      pbVar1 = (stringArray->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar4 < (long)(stringArray->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
      lVar4 = lVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&stringStream,
                             (string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    std::operator<<(poVar2,'\n');
    lVar3 = lVar3 + 0x20;
  }
  std::__cxx11::stringbuf::str();
  std::vector<char,_std::allocator<char>_>::vector
            (&__return_storage_ptr__->super_vector<char,_std::allocator<char>_>,local_1c0 + 1,
             &local_1c9);
  std::__cxx11::string::~string((string *)&local_1c8);
  __dest = (__return_storage_ptr__->super_vector<char,_std::allocator<char>_>).
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::stringbuf::str();
  strcpy(__dest,local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stringStream);
  return __return_storage_ptr__;
}

Assistant:

amrex::Vector<char> amrex::SerializeStringArray(const Vector<std::string> &stringArray)
{
  std::ostringstream stringStream;
  for(int i(0); i < stringArray.size(); ++i) {
    stringStream << stringArray[i] << '\n';
  }

  Vector<char> charArray(stringStream.str().size() + 1);
  std::strcpy(charArray.dataPtr(), stringStream.str().c_str());  // null terminated

  return charArray;
}